

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

DataType __thiscall
csv::internals::data_type(internals *this,string_view in,longdouble *out,char decimalSymbol)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  DataType DVar5;
  bool bVar6;
  char *pcVar7;
  bool bVar8;
  longdouble *out_00;
  bool bVar9;
  uint uVar10;
  size_type __pos;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar11;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar12;
  basic_string_view<char,_std::char_traits<char>_> bVar13;
  string_view exponential_part;
  uint places_after_decimal;
  longdouble local_88;
  longdouble local_7c;
  longdouble *local_70;
  longdouble local_68;
  internals *local_58;
  longdouble local_4c;
  string_view in_local;
  
  local_70 = (longdouble *)in._M_str;
  pcVar7 = (char *)in._M_len;
  if (this == (internals *)0x0) {
    DVar5 = CSV_NULL;
  }
  else {
    out_00 = (longdouble *)&places_after_decimal;
    places_after_decimal = 0;
    bVar4 = true;
    local_68 = (longdouble)0;
    uVar10 = 0;
    bVar9 = false;
    bVar8 = false;
    bVar6 = false;
    cVar3 = '\x01';
    bVar2 = true;
    lVar11 = local_68;
    local_58 = this;
    in_local._M_len = (size_t)this;
    in_local._M_str = pcVar7;
    for (__pos = 2; __pos - (long)this != 2; __pos = __pos + 1) {
      cVar1 = pcVar7[__pos - 2];
      if (cVar1 == ' ') {
        if (!bVar2) {
          if (9 < (int)pcVar7[__pos - 3] - 0x30U) {
            return CSV_STRING;
          }
          bVar2 = true;
          bVar4 = false;
        }
      }
      else {
        if (cVar1 != '+') {
          if (cVar1 != '-') {
            if ((cVar1 == 'E') || (cVar1 == 'e')) {
              if (!bVar9) {
                if (local_58 <= (internals *)(__pos - 1) || __pos == 2) {
                  return CSV_STRING;
                }
                if (9 < (int)pcVar7[__pos - 3] - 0x30U) {
                  return CSV_STRING;
                }
              }
              if (pcVar7[__pos - 1] != '+') {
                __pos = __pos - 1;
              }
              local_88 = local_68;
              local_7c = lVar11;
              bVar13 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 (&in_local,__pos,0xffffffffffffffff);
              local_68 = local_88 + local_7c;
              if (bVar6) {
                local_68 = -(local_88 + local_7c);
              }
              exponential_part._M_str = (char *)&local_68;
              exponential_part._M_len = (size_t)bVar13._M_str;
              DVar5 = _process_potential_exponential
                                ((internals *)bVar13._M_len,exponential_part,local_70,out_00);
              return DVar5;
            }
            if ((byte)(cVar1 - 0x30U) < 10) {
              if (!bVar4) {
                return CSV_STRING;
              }
              if (bVar2) {
                bVar2 = false;
              }
              if (bVar9) {
                uVar10 = uVar10 + 1;
                out = (longdouble *)((ulong)out & 0xffffffff);
                lVar12 = in_ST4;
                places_after_decimal = uVar10;
                local_88 = local_68;
                local_7c = lVar11;
                local_4c = (longdouble)(cVar1 + -0x30);
                pow10<unsigned_int>((uint *)out_00);
                local_68 = local_88 + local_4c / in_ST0;
                bVar8 = true;
                bVar4 = true;
                lVar11 = local_7c;
                in_ST0 = in_ST1;
                in_ST1 = in_ST2;
                in_ST2 = in_ST3;
                in_ST3 = in_ST4;
                in_ST4 = lVar12;
              }
              else {
                lVar11 = lVar11 * (longdouble)10.0 + (longdouble)(cVar1 + -0x30);
                bVar8 = true;
                bVar4 = true;
              }
            }
            else {
              if (cVar3 != -1 || cVar1 != (char)out) {
                return CSV_STRING;
              }
              bVar9 = true;
              cVar3 = '\0';
            }
            goto LAB_0010bd46;
          }
          bVar6 = true;
        }
        if (!bVar2) {
          return CSV_STRING;
        }
      }
LAB_0010bd46:
    }
    DVar5 = CSV_NULL;
    if (bVar8) {
      local_68 = local_68 + lVar11;
      if (local_70 != (longdouble *)0x0) {
        lVar11 = local_68;
        if (bVar6) {
          lVar11 = -local_68;
        }
        *local_70 = lVar11;
      }
      if (bVar9) {
        DVar5 = CSV_DOUBLE;
      }
      else {
        DVar5 = _determine_integral_type(&local_68);
      }
    }
  }
  return DVar5;
}

Assistant:

CONSTEXPR_14
        DataType data_type(csv::string_view in, long double* const out, const char decimalSymbol) {
            // Empty string --> NULL
            if (in.size() == 0)
                return DataType::CSV_NULL;

            bool ws_allowed = true,
                dot_allowed = true,
                digit_allowed = true,
                is_negative = false,
                has_digit = false,
                prob_float = false;

            unsigned places_after_decimal = 0;
            long double integral_part = 0,
                decimal_part = 0;

            for (size_t i = 0, ilen = in.size(); i < ilen; i++) {
                const char& current = in[i];

                switch (current) {
                case ' ':
                    if (!ws_allowed) {
                        if (isdigit(in[i - 1])) {
                            digit_allowed = false;
                            ws_allowed = true;
                        }
                        else {
                            // Ex: '510 123 4567'
                            return DataType::CSV_STRING;
                        }
                    }
                    break;
                case '+':
                    if (!ws_allowed) {
                        return DataType::CSV_STRING;
                    }

                    break;
                case '-':
                    if (!ws_allowed) {
                        // Ex: '510-123-4567'
                        return DataType::CSV_STRING;
                    }

                    is_negative = true;
                    break;
                // case decimalSymbol: not allowed because decimalSymbol is not a literal,
                // it is handled in the default block
                case 'e':
                case 'E':
                    // Process scientific notation
                    if (prob_float || (i && i + 1 < ilen && isdigit(in[i - 1]))) {
                        size_t exponent_start_idx = i + 1;
                        prob_float = true;

                        // Strip out plus sign
                        if (in[i + 1] == '+') {
                            exponent_start_idx++;
                        }

                        return _process_potential_exponential(
                            in.substr(exponent_start_idx),
                            is_negative ? -(integral_part + decimal_part) : integral_part + decimal_part,
                            out
                        );
                    }

                    return DataType::CSV_STRING;
                    break;
                default:
                    short digit = static_cast<short>(current - '0');
                    if (digit >= 0 && digit <= 9) {
                        // Process digit
                        has_digit = true;

                        if (!digit_allowed)
                            return DataType::CSV_STRING;
                        else if (ws_allowed) // Ex: '510 456'
                            ws_allowed = false;

                        // Build current number
                        if (prob_float)
                            decimal_part += digit / pow10(++places_after_decimal);
                        else
                            integral_part = (integral_part * 10) + digit;
                    }
                    // case decimalSymbol: not allowed because decimalSymbol is not a literal. 
                    else if (dot_allowed && current == decimalSymbol) {
                        dot_allowed = false;
                        prob_float = true;
                    }
                    else {
                        return DataType::CSV_STRING;
                    }
                }
            }

            // No non-numeric/non-whitespace characters found
            if (has_digit) {
                long double number = integral_part + decimal_part;
                if (out) {
                    *out = is_negative ? -number : number;
                }

                return prob_float ? DataType::CSV_DOUBLE : _determine_integral_type(number);
            }

            // Just whitespace
            return DataType::CSV_NULL;
        }